

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

void GENERAL_NAME_set0_value(GENERAL_NAME *a,int type,void *value)

{
  void *value_local;
  int type_local;
  GENERAL_NAME *a_local;
  
  switch(type) {
  case 0:
    (a->d).ptr = (char *)value;
    break;
  case 1:
  case 2:
  case 6:
    (a->d).ptr = (char *)value;
    break;
  case 3:
    (a->d).ptr = (char *)value;
    break;
  case 4:
    (a->d).ptr = (char *)value;
    break;
  case 5:
    (a->d).ptr = (char *)value;
    break;
  case 7:
    (a->d).ptr = (char *)value;
    break;
  case 8:
    (a->d).ptr = (char *)value;
  }
  a->type = type;
  return;
}

Assistant:

void GENERAL_NAME_set0_value(GENERAL_NAME *a, int type, void *value) {
  switch (type) {
    case GEN_X400:
      a->d.x400Address = reinterpret_cast<ASN1_STRING *>(value);
      break;

    case GEN_EDIPARTY:
      a->d.ediPartyName = reinterpret_cast<EDIPARTYNAME *>(value);
      break;

    case GEN_OTHERNAME:
      a->d.otherName = reinterpret_cast<OTHERNAME *>(value);
      break;

    case GEN_EMAIL:
    case GEN_DNS:
    case GEN_URI:
      a->d.ia5 = reinterpret_cast<ASN1_STRING *>(value);
      break;

    case GEN_DIRNAME:
      a->d.dirn = reinterpret_cast<X509_NAME *>(value);
      break;

    case GEN_IPADD:
      a->d.ip = reinterpret_cast<ASN1_STRING *>(value);
      break;

    case GEN_RID:
      a->d.rid = reinterpret_cast<ASN1_OBJECT *>(value);
      break;
  }
  a->type = type;
}